

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlMasterElement(IMkvWriter *writer,uint64 type,uint64 size)

{
  int32 iVar1;
  uint64 size_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local._7_1_ = false;
  }
  else {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(writer,size);
      if (iVar1 == 0) {
        writer_local._7_1_ = true;
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlMasterElement(IMkvWriter* writer, uint64 type, uint64 size) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, size))
    return false;

  return true;
}